

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_freeDDict(ZSTD_DDict *ddict)

{
  void *pvVar1;
  ZSTD_freeFunction p_Var2;
  
  if (ddict != (ZSTD_DDict *)0x0) {
    pvVar1 = (ddict->cMem).opaque;
    p_Var2 = (ddict->cMem).customFree;
    ZSTD_free(ddict->dictBuffer,ddict->cMem);
    if (p_Var2 == (ZSTD_freeFunction)0x0) {
      free(ddict);
    }
    else {
      (*p_Var2)(pvVar1,ddict);
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_freeDDict(ZSTD_DDict* ddict)
{
    if (ddict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = ddict->cMem;
        ZSTD_free(ddict->dictBuffer, cMem);
        ZSTD_free(ddict, cMem);
        return 0;
    }
}